

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

void * provider_store_new(OSSL_LIB_CTX *ctx)

{
  undefined8 *puVar1;
  stack_st_OSSL_PROVIDER *psVar2;
  CRYPTO_RWLOCK *pCVar3;
  stack_st_OSSL_PROVIDER_CHILD_CB *psVar4;
  void *in_RDI;
  provider_store_st *store;
  char *in_stack_fffffffffffffff8;
  
  puVar1 = (undefined8 *)
           CRYPTO_zalloc((size_t)store,in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20));
  if (puVar1 != (undefined8 *)0x0) {
    psVar2 = sk_OSSL_PROVIDER_new((sk_OSSL_PROVIDER_compfunc)0x293ea6);
    puVar1[1] = psVar2;
    if (psVar2 != (stack_st_OSSL_PROVIDER *)0x0) {
      pCVar3 = CRYPTO_THREAD_lock_new();
      puVar1[3] = pCVar3;
      if (pCVar3 != (CRYPTO_RWLOCK *)0x0) {
        psVar4 = sk_OSSL_PROVIDER_CHILD_CB_new_null();
        puVar1[2] = psVar4;
        if (psVar4 != (stack_st_OSSL_PROVIDER_CHILD_CB *)0x0) {
          pCVar3 = CRYPTO_THREAD_lock_new();
          puVar1[4] = pCVar3;
          if (pCVar3 != (CRYPTO_RWLOCK *)0x0) {
            *puVar1 = in_RDI;
            *(byte *)(puVar1 + 9) = *(byte *)(puVar1 + 9) & 0xfe | 1;
            return puVar1;
          }
        }
      }
    }
  }
  provider_store_free(in_RDI);
  return (void *)0x0;
}

Assistant:

static void *provider_store_new(OSSL_LIB_CTX *ctx)
{
    struct provider_store_st *store = OPENSSL_zalloc(sizeof(*store));

    if (store == NULL
        || (store->providers = sk_OSSL_PROVIDER_new(ossl_provider_cmp)) == NULL
        || (store->default_path_lock = CRYPTO_THREAD_lock_new()) == NULL
#ifndef FIPS_MODULE
        || (store->child_cbs = sk_OSSL_PROVIDER_CHILD_CB_new_null()) == NULL
#endif
        || (store->lock = CRYPTO_THREAD_lock_new()) == NULL) {
        provider_store_free(store);
        return NULL;
    }
    store->libctx = ctx;
    store->use_fallbacks = 1;

    return store;
}